

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

writer * argo::operator<<(writer *w,double d)

{
  ostringstream ss;
  string local_1a8 [32];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x11;
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(d);
  std::__cxx11::stringbuf::str();
  (*w->_vptr_writer[2])(w,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, double d)
{
    ostringstream ss;
    ss << setprecision(17) << fixed << d;
    w.write(ss.str());
    return w;
}